

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

uint8_t * __thiscall
Lodtalk::MethodAssembler::UnconditionalJump::encode(UnconditionalJump *this,uint8_t *buffer)

{
  ptrdiff_t pVar1;
  uint8_t *puVar2;
  ptrdiff_t delta;
  uint8_t *buffer_local;
  UnconditionalJump *this_local;
  
  pVar1 = jumpDeltaValue(this);
  this_local = (UnconditionalJump *)buffer;
  if (pVar1 != 0) {
    if ((pVar1 < 1) || (8 < pVar1)) {
      puVar2 = InstructionNode::encodeExtB(&this->super_InstructionNode,buffer,pVar1 / 0x100);
      *puVar2 = 0xed;
      this_local = (UnconditionalJump *)(puVar2 + 2);
      puVar2[1] = (uint8_t)(pVar1 % 0x100);
    }
    else {
      this_local = (UnconditionalJump *)(buffer + 1);
      *buffer = (char)pVar1 + 0xaf;
    }
  }
  return (uint8_t *)this_local;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
        auto delta = jumpDeltaValue();
        if(delta == 0)
            return buffer;

        if(1 <= delta && delta <= 8)
        {
            *buffer++ = uint8_t(BytecodeSet::JumpShortFirst + delta - 1);
            return buffer;
        }

        buffer = encodeExtB(buffer, delta / 256);
        *buffer++ = BytecodeSet::Jump;
        *buffer++ = delta % 256;
		return buffer;
	}